

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall
amrex::MLEBABecLap::interpolation
          (MLEBABecLap *this,int amrlev,int fmglev,MultiFab *fine,MultiFab *crse)

{
  uint uVar1;
  uint uVar2;
  FabType FVar3;
  long lVar4;
  FabArray<amrex::EBCellFlagFab> *pFVar5;
  int *piVar6;
  uint32_t *puVar7;
  uint uVar8;
  double *pdVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  bool bVar18;
  MFIter mfi;
  ulong local_1e0;
  ulong local_1d0;
  long local_1c8;
  long local_1b8;
  Box local_18c;
  FabArray<amrex::FArrayBox> *local_170;
  ulong local_168;
  FabArray<amrex::EBCellFlagFab> *local_160;
  FabArray<amrex::FArrayBox> *local_158;
  Array4<double> local_150;
  Array4<const_double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter local_90;
  
  lVar4 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                              super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[amrlev].
                              super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                   + (long)fmglev * 8);
  local_170 = &fine->super_FabArray<amrex::FArrayBox>;
  local_158 = &crse->super_FabArray<amrex::FArrayBox>;
  if (lVar4 == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(lVar4,&FabFactory<amrex::FArrayBox>::typeinfo,
                           &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar4 == 0) {
    pFVar5 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    pFVar5 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar4 + 0xd8));
  }
  uVar2 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  MFIter::MFIter(&local_90,&local_170->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_168 = (ulong)uVar2;
    local_160 = pFVar5;
    do {
      pFVar5 = local_160;
      MFIter::tilebox(&local_18c,&local_90);
      FVar3 = regular;
      if (pFVar5 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
        piVar6 = &local_90.currentIndex;
        if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar6 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_90.currentIndex;
        }
        FVar3 = EBCellFlagFab::getType
                          ((pFVar5->m_fabs_v).
                           super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[*piVar6],&local_18c);
      }
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_110,local_158,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_150,local_170,&local_90);
      if (FVar3 == singlevalued) {
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_d0,pFVar5,&local_90);
        if (0 < (int)uVar2) {
          uVar12 = (ulong)local_18c.smallend.vect[0];
          local_1b8 = 0;
          local_1e0 = 0;
          do {
            uVar1 = local_18c.smallend.vect[2];
            if (local_18c.smallend.vect[2] <= local_18c.bigend.vect[2]) {
              do {
                if (local_18c.smallend.vect[1] <= local_18c.bigend.vect[1]) {
                  uVar8 = uVar1 + 1;
                  uVar11 = -uVar8;
                  if (0 < (int)uVar8) {
                    uVar11 = uVar8;
                  }
                  uVar11 = ~(uVar11 >> 1);
                  if (-1 < (int)uVar1) {
                    uVar11 = uVar1 >> 1;
                  }
                  puVar7 = (uint32_t *)
                           ((long)&local_d0.p
                                   [uVar12 + (((long)(int)uVar1 - (long)local_d0.begin.z) *
                                              local_d0.kstride - (long)local_d0.begin.x)].flag +
                           ((long)local_18c.smallend.vect[1] - (long)local_d0.begin.y) *
                           local_d0.jstride * 4);
                  uVar14 = (long)local_18c.smallend.vect[1];
                  do {
                    if (local_18c.smallend.vect[0] <= local_18c.bigend.vect[0]) {
                      uVar13 = (int)uVar14 + 1;
                      uVar8 = -uVar13;
                      if (0 < (int)uVar13) {
                        uVar8 = uVar13;
                      }
                      uVar8 = ~(uVar8 >> 1);
                      if (-1 < (long)uVar14) {
                        uVar8 = (uint)(uVar14 >> 1) & 0x7fffffff;
                      }
                      lVar4 = local_150.nstride * local_1b8 +
                              ((long)(int)uVar1 - (long)local_150.begin.z) * local_150.kstride * 8 +
                              (uVar14 - (long)local_150.begin.y) * local_150.jstride * 8 +
                              (long)local_150.begin.x * -8 + uVar12 * 8;
                      lVar16 = 0;
                      uVar15 = uVar12;
                      do {
                        if ((~*(uint *)((long)puVar7 + lVar16) & 3) != 0) {
                          if ((long)uVar15 < 0) {
                            uVar17 = (int)uVar15 + 1;
                            uVar13 = -uVar17;
                            if (0 < (int)uVar17) {
                              uVar13 = uVar17;
                            }
                            uVar13 = ~(uVar13 >> 1);
                          }
                          else {
                            uVar13 = (uint)(uVar15 >> 1) & 0x7fffffff;
                          }
                          *(double *)((long)local_150.p + lVar16 * 2 + lVar4) =
                               local_110.p
                               [((long)(int)uVar8 - (long)local_110.begin.y) * local_110.jstride +
                                ((long)(int)uVar11 - (long)local_110.begin.z) * local_110.kstride +
                                local_110.nstride * local_1e0 +
                                ((long)(int)uVar13 - (long)local_110.begin.x)] +
                               *(double *)((long)local_150.p + lVar16 * 2 + lVar4);
                        }
                        uVar15 = uVar15 + 1;
                        lVar16 = lVar16 + 4;
                      } while (local_18c.bigend.vect[0] + 1 != (int)uVar15);
                    }
                    uVar14 = uVar14 + 1;
                    puVar7 = puVar7 + local_d0.jstride;
                  } while (local_18c.bigend.vect[1] + 1 != (int)uVar14);
                }
                bVar18 = uVar1 != local_18c.bigend.vect[2];
                uVar1 = uVar1 + 1;
              } while (bVar18);
            }
            local_1e0 = local_1e0 + 1;
            local_1b8 = local_1b8 + 8;
          } while (local_1e0 != local_168);
        }
      }
      else if ((FVar3 == regular) && (0 < (int)uVar2)) {
        local_1c8 = 0;
        local_1d0 = 0;
        do {
          uVar1 = local_18c.smallend.vect[2];
          if (local_18c.smallend.vect[2] <= local_18c.bigend.vect[2]) {
            do {
              if (local_18c.smallend.vect[1] <= local_18c.bigend.vect[1]) {
                uVar8 = uVar1 + 1;
                uVar11 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar11 = uVar8;
                }
                uVar11 = ~(uVar11 >> 1);
                if (-1 < (int)uVar1) {
                  uVar11 = uVar1 >> 1;
                }
                pdVar9 = (double *)
                         ((long)local_150.p +
                         local_150.nstride * local_1c8 +
                         ((long)local_18c.smallend.vect[1] - (long)local_150.begin.y) *
                         local_150.jstride * 8 +
                         ((long)(int)uVar1 - (long)local_150.begin.z) * local_150.kstride * 8 +
                         (long)local_150.begin.x * -8 + (long)local_18c.smallend.vect[0] * 8);
                uVar12 = (long)local_18c.smallend.vect[1];
                do {
                  if (local_18c.smallend.vect[0] <= local_18c.bigend.vect[0]) {
                    uVar13 = (int)uVar12 + 1;
                    uVar8 = -uVar13;
                    if (0 < (int)uVar13) {
                      uVar8 = uVar13;
                    }
                    uVar8 = ~(uVar8 >> 1);
                    if (-1 < (long)uVar12) {
                      uVar8 = (uint)(uVar12 >> 1) & 0x7fffffff;
                    }
                    pdVar10 = pdVar9;
                    uVar14 = (long)local_18c.smallend.vect[0];
                    do {
                      if ((long)uVar14 < 0) {
                        uVar17 = (int)uVar14 + 1;
                        uVar13 = -uVar17;
                        if (0 < (int)uVar17) {
                          uVar13 = uVar17;
                        }
                        uVar13 = ~(uVar13 >> 1);
                      }
                      else {
                        uVar13 = (uint)(uVar14 >> 1) & 0x7fffffff;
                      }
                      *pdVar10 = local_110.p
                                 [((long)(int)uVar11 - (long)local_110.begin.z) * local_110.kstride
                                  + local_110.nstride * local_1d0 +
                                    ((long)(int)uVar8 - (long)local_110.begin.y) * local_110.jstride
                                    + ((long)(int)uVar13 - (long)local_110.begin.x)] + *pdVar10;
                      uVar14 = uVar14 + 1;
                      pdVar10 = pdVar10 + 1;
                    } while (local_18c.bigend.vect[0] + 1 != (int)uVar14);
                  }
                  uVar12 = uVar12 + 1;
                  pdVar9 = pdVar9 + local_150.jstride;
                } while (local_18c.bigend.vect[1] + 1 != (int)uVar12);
              }
              bVar18 = uVar1 != local_18c.bigend.vect[2];
              uVar1 = uVar1 + 1;
            } while (bVar18);
          }
          local_1d0 = local_1d0 + 1;
          local_1c8 = local_1c8 + 8;
        } while (local_1d0 != local_168);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLEBABecLap::interpolation (int amrlev, int fmglev, MultiFab& fine, const MultiFab& crse) const
{
    BL_PROFILE("MLEBABecLap::interpolation()");

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][fmglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const int ncomp = getNComp();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        Array4<Real const> const& cfab = crse.const_array(mfi);
        Array4<Real> const& ffab = fine.array(mfi);

        if (fabtyp == FabType::regular)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                int ic = amrex::coarsen(i,2);
                int jc = amrex::coarsen(j,2);
                int kc = amrex::coarsen(k,2);
                ffab(i,j,k,n) += cfab(ic,jc,kc,n);
            });
        }
        else if (fabtyp == FabType::singlevalued)
        {
            Array4<EBCellFlag const> const& flg = flags->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (!flg(i,j,k).isCovered()) {
                    int ic = amrex::coarsen(i,2);
                    int jc = amrex::coarsen(j,2);
                    int kc = amrex::coarsen(k,2);
                    ffab(i,j,k,n) += cfab(ic,jc,kc,n);
                }
            });
        }
    }
}